

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O2

drmp3_bool32
drmp3_calculate_seek_points(drmp3 *pMP3,drmp3_uint32 *pSeekPointCount,drmp3_seek_point *pSeekPoints)

{
  drmp3_uint64 dVar1;
  drmp3_bool32 dVar2;
  drmp3_uint32 dVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  float runningPCMFrameCountFractionalPart;
  drmp3_uint64 runningPCMFrameCount;
  ulong local_a8;
  drmp3_uint32 *local_a0;
  drmp3_uint64 local_98;
  drmp3_seek_point *local_90;
  ulong local_88;
  ulong local_80;
  drmp3_uint64 totalPCMFrameCount;
  drmp3_uint64 totalMP3FrameCount;
  drmp3__seeking_mp3_frame_info mp3FrameInfo [3];
  
  if (pSeekPoints == (drmp3_seek_point *)0x0 ||
      (pSeekPointCount == (drmp3_uint32 *)0x0 || pMP3 == (drmp3 *)0x0)) {
    return 0;
  }
  uVar5 = (ulong)*pSeekPointCount;
  if (uVar5 == 0) {
    return 0;
  }
  dVar1 = pMP3->currentPCMFrame;
  dVar2 = drmp3_get_mp3_and_pcm_frame_count(pMP3,&totalMP3FrameCount,&totalPCMFrameCount);
  if (dVar2 == 0) {
    return 0;
  }
  if (totalMP3FrameCount < 3) {
    pSeekPoints->seekPosInBytes = 0;
    pSeekPoints->pcmFrameIndex = 0;
    pSeekPoints->mp3FramesToDiscard = 0;
    pSeekPoints->pcmFramesToDiscard = 0;
    dVar3 = 1;
LAB_00111d85:
    dVar2 = 1;
    *pSeekPointCount = dVar3;
  }
  else {
    runningPCMFrameCount = 0;
    runningPCMFrameCountFractionalPart = 0.0;
    local_a8 = (ulong)((int)totalMP3FrameCount - 1);
    if (uVar5 <= totalMP3FrameCount - 1) {
      local_a8 = uVar5;
    }
    local_80 = totalPCMFrameCount / ((int)local_a8 + 1);
    local_98 = dVar1;
    dVar2 = drmp3_seek_to_start_of_stream(pMP3);
    if (dVar2 != 0) {
      for (lVar4 = 8; lVar4 != 0x38; lVar4 = lVar4 + 0x10) {
        *(drmp3_uint64 *)((long)mp3FrameInfo + lVar4 + -8) = pMP3->streamCursor - pMP3->dataSize;
        *(drmp3_uint64 *)((long)&mp3FrameInfo[0].bytePos + lVar4) = runningPCMFrameCount;
        dVar3 = drmp3_decode_next_frame_ex(pMP3,(drmp3d_sample_t *)0x0);
        if (dVar3 == 0) goto LAB_00111f19;
        drmp3__accumulate_running_pcm_frame_count
                  (pMP3,dVar3,&runningPCMFrameCount,&runningPCMFrameCountFractionalPart);
      }
      local_88 = local_a8 & 0xffffffff;
      uVar6 = 0;
      local_a0 = pSeekPointCount;
      local_90 = pSeekPoints;
      for (uVar5 = 0; uVar5 != local_88; uVar5 = uVar5 + 1) {
        uVar6 = uVar6 + local_80;
        while (runningPCMFrameCount <= uVar6) {
          mp3FrameInfo[0].bytePos = mp3FrameInfo[1].bytePos;
          mp3FrameInfo[0].pcmFrameIndex = mp3FrameInfo[1].pcmFrameIndex;
          mp3FrameInfo[1].bytePos = mp3FrameInfo[2].bytePos;
          mp3FrameInfo[1].pcmFrameIndex = mp3FrameInfo[2].pcmFrameIndex;
          mp3FrameInfo[2].bytePos = pMP3->streamCursor - pMP3->dataSize;
          mp3FrameInfo[2].pcmFrameIndex = runningPCMFrameCount;
          dVar3 = drmp3_decode_next_frame_ex(pMP3,(drmp3d_sample_t *)0x0);
          if (dVar3 == 0) break;
          drmp3__accumulate_running_pcm_frame_count
                    (pMP3,dVar3,&runningPCMFrameCount,&runningPCMFrameCountFractionalPart);
        }
        local_90[uVar5].seekPosInBytes = mp3FrameInfo[0].bytePos;
        local_90[uVar5].pcmFrameIndex = uVar6;
        local_90[uVar5].mp3FramesToDiscard = 2;
        local_90[uVar5].pcmFramesToDiscard = (short)uVar6 - (short)mp3FrameInfo[1].pcmFrameIndex;
      }
      dVar2 = drmp3_seek_to_start_of_stream(pMP3);
      pSeekPointCount = local_a0;
      if (dVar2 != 0) {
        dVar2 = drmp3_seek_to_pcm_frame(pMP3,local_98);
        dVar3 = (drmp3_uint32)local_a8;
        if (dVar2 != 0) goto LAB_00111d85;
      }
    }
LAB_00111f19:
    dVar2 = 0;
  }
  return dVar2;
}

Assistant:

DRMP3_API drmp3_bool32 drmp3_calculate_seek_points(drmp3* pMP3, drmp3_uint32* pSeekPointCount, drmp3_seek_point* pSeekPoints)
{
    drmp3_uint32 seekPointCount;
    drmp3_uint64 currentPCMFrame;
    drmp3_uint64 totalMP3FrameCount;
    drmp3_uint64 totalPCMFrameCount;

    if (pMP3 == NULL || pSeekPointCount == NULL || pSeekPoints == NULL) {
        return DRMP3_FALSE; /* Invalid args. */
    }

    seekPointCount = *pSeekPointCount;
    if (seekPointCount == 0) {
        return DRMP3_FALSE;  /* The client has requested no seek points. Consider this to be invalid arguments since the client has probably not intended this. */
    }

    /* We'll need to seek back to the current sample after calculating the seekpoints so we need to go ahead and grab the current location at the top. */
    currentPCMFrame = pMP3->currentPCMFrame;

    /* We never do more than the total number of MP3 frames and we limit it to 32-bits. */
    if (!drmp3_get_mp3_and_pcm_frame_count(pMP3, &totalMP3FrameCount, &totalPCMFrameCount)) {
        return DRMP3_FALSE;
    }

    /* If there's less than DRMP3_SEEK_LEADING_MP3_FRAMES+1 frames we just report 1 seek point which will be the very start of the stream. */
    if (totalMP3FrameCount < DRMP3_SEEK_LEADING_MP3_FRAMES+1) {
        seekPointCount = 1;
        pSeekPoints[0].seekPosInBytes     = 0;
        pSeekPoints[0].pcmFrameIndex      = 0;
        pSeekPoints[0].mp3FramesToDiscard = 0;
        pSeekPoints[0].pcmFramesToDiscard = 0;
    } else {
        drmp3_uint64 pcmFramesBetweenSeekPoints;
        drmp3__seeking_mp3_frame_info mp3FrameInfo[DRMP3_SEEK_LEADING_MP3_FRAMES+1];
        drmp3_uint64 runningPCMFrameCount = 0;
        float runningPCMFrameCountFractionalPart = 0;
        drmp3_uint64 nextTargetPCMFrame;
        drmp3_uint32 iMP3Frame;
        drmp3_uint32 iSeekPoint;

        if (seekPointCount > totalMP3FrameCount-1) {
            seekPointCount = (drmp3_uint32)totalMP3FrameCount-1;
        }

        pcmFramesBetweenSeekPoints = totalPCMFrameCount / (seekPointCount+1);

        /*
        Here is where we actually calculate the seek points. We need to start by moving the start of the stream. We then enumerate over each
        MP3 frame.
        */
        if (!drmp3_seek_to_start_of_stream(pMP3)) {
            return DRMP3_FALSE;
        }

        /*
        We need to cache the byte positions of the previous MP3 frames. As a new MP3 frame is iterated, we cycle the byte positions in this
        array. The value in the first item in this array is the byte position that will be reported in the next seek point.
        */

        /* We need to initialize the array of MP3 byte positions for the leading MP3 frames. */
        for (iMP3Frame = 0; iMP3Frame < DRMP3_SEEK_LEADING_MP3_FRAMES+1; ++iMP3Frame) {
            drmp3_uint32 pcmFramesInCurrentMP3FrameIn;

            /* The byte position of the next frame will be the stream's cursor position, minus whatever is sitting in the buffer. */
            DRMP3_ASSERT(pMP3->streamCursor >= pMP3->dataSize);
            mp3FrameInfo[iMP3Frame].bytePos       = pMP3->streamCursor - pMP3->dataSize;
            mp3FrameInfo[iMP3Frame].pcmFrameIndex = runningPCMFrameCount;

            /* We need to get information about this frame so we can know how many samples it contained. */
            pcmFramesInCurrentMP3FrameIn = drmp3_decode_next_frame_ex(pMP3, NULL);
            if (pcmFramesInCurrentMP3FrameIn == 0) {
                return DRMP3_FALSE; /* This should never happen. */
            }

            drmp3__accumulate_running_pcm_frame_count(pMP3, pcmFramesInCurrentMP3FrameIn, &runningPCMFrameCount, &runningPCMFrameCountFractionalPart);
        }

        /*
        At this point we will have extracted the byte positions of the leading MP3 frames. We can now start iterating over each seek point and
        calculate them.
        */
        nextTargetPCMFrame = 0;
        for (iSeekPoint = 0; iSeekPoint < seekPointCount; ++iSeekPoint) {
            nextTargetPCMFrame += pcmFramesBetweenSeekPoints;

            for (;;) {
                if (nextTargetPCMFrame < runningPCMFrameCount) {
                    /* The next seek point is in the current MP3 frame. */
                    pSeekPoints[iSeekPoint].seekPosInBytes     = mp3FrameInfo[0].bytePos;
                    pSeekPoints[iSeekPoint].pcmFrameIndex      = nextTargetPCMFrame;
                    pSeekPoints[iSeekPoint].mp3FramesToDiscard = DRMP3_SEEK_LEADING_MP3_FRAMES;
                    pSeekPoints[iSeekPoint].pcmFramesToDiscard = (drmp3_uint16)(nextTargetPCMFrame - mp3FrameInfo[DRMP3_SEEK_LEADING_MP3_FRAMES-1].pcmFrameIndex);
                    break;
                } else {
                    size_t i;
                    drmp3_uint32 pcmFramesInCurrentMP3FrameIn;

                    /*
                    The next seek point is not in the current MP3 frame, so continue on to the next one. The first thing to do is cycle the cached
                    MP3 frame info.
                    */
                    for (i = 0; i < DRMP3_COUNTOF(mp3FrameInfo)-1; ++i) {
                        mp3FrameInfo[i] = mp3FrameInfo[i+1];
                    }

                    /* Cache previous MP3 frame info. */
                    mp3FrameInfo[DRMP3_COUNTOF(mp3FrameInfo)-1].bytePos       = pMP3->streamCursor - pMP3->dataSize;
                    mp3FrameInfo[DRMP3_COUNTOF(mp3FrameInfo)-1].pcmFrameIndex = runningPCMFrameCount;

                    /*
                    Go to the next MP3 frame. This shouldn't ever fail, but just in case it does we just set the seek point and break. If it happens, it
                    should only ever do it for the last seek point.
                    */
                    pcmFramesInCurrentMP3FrameIn = drmp3_decode_next_frame_ex(pMP3, NULL);
                    if (pcmFramesInCurrentMP3FrameIn == 0) {
                        pSeekPoints[iSeekPoint].seekPosInBytes     = mp3FrameInfo[0].bytePos;
                        pSeekPoints[iSeekPoint].pcmFrameIndex      = nextTargetPCMFrame;
                        pSeekPoints[iSeekPoint].mp3FramesToDiscard = DRMP3_SEEK_LEADING_MP3_FRAMES;
                        pSeekPoints[iSeekPoint].pcmFramesToDiscard = (drmp3_uint16)(nextTargetPCMFrame - mp3FrameInfo[DRMP3_SEEK_LEADING_MP3_FRAMES-1].pcmFrameIndex);
                        break;
                    }

                    drmp3__accumulate_running_pcm_frame_count(pMP3, pcmFramesInCurrentMP3FrameIn, &runningPCMFrameCount, &runningPCMFrameCountFractionalPart);
                }
            }
        }

        /* Finally, we need to seek back to where we were. */
        if (!drmp3_seek_to_start_of_stream(pMP3)) {
            return DRMP3_FALSE;
        }
        if (!drmp3_seek_to_pcm_frame(pMP3, currentPCMFrame)) {
            return DRMP3_FALSE;
        }
    }

    *pSeekPointCount = seekPointCount;
    return DRMP3_TRUE;
}